

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_expr.cpp
# Opt level: O0

void BR_SOR<>(void)

{
  ostream *poVar1;
  bool result;
  
  std::operator<<((ostream *)&std::cout,"\nBINARY LEFT FOLD:\tBR_ADD():\t");
  poVar1 = std::operator<<((ostream *)&std::cout,"false");
  std::operator<<(poVar1,'.');
  return;
}

Assistant:

void BR_SOR (varargs... x) {
	std::cout<< "\nBINARY LEFT FOLD:\tBR_ADD():\t";
	bool result = (false || ... ||  x);
	if (result == 1)
		std::cout<< "true" << '.';
	else
		std::cout<< "false" << '.';
}